

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read_file.cpp
# Opt level: O3

unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true> __thiscall
duckdb::ReadFileCardinality(duckdb *this,ClientContext *context,FunctionData *bind_data_p)

{
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  undefined1 *puVar3;
  pointer pNVar4;
  pointer *__ptr;
  
  puVar3 = (undefined1 *)operator_new(0x20);
  *puVar3 = 0;
  puVar3[0x10] = 0;
  *(undefined1 **)this = puVar3;
  pNVar4 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>::
           operator->((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                       *)this);
  pNVar4->has_max_cardinality = true;
  pp_Var1 = bind_data_p[4]._vptr_FunctionData;
  pp_Var2 = bind_data_p[5]._vptr_FunctionData;
  pNVar4 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>::
           operator->((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                       *)this);
  pNVar4->max_cardinality = ((long)pp_Var2 - (long)pp_Var1 >> 4) * -0x5555555555555555;
  pNVar4 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>::
           operator->((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                       *)this);
  pNVar4->has_estimated_cardinality = true;
  pp_Var1 = bind_data_p[4]._vptr_FunctionData;
  pp_Var2 = bind_data_p[5]._vptr_FunctionData;
  pNVar4 = unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>::
           operator->((unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true>
                       *)this);
  pNVar4->estimated_cardinality = ((long)pp_Var2 - (long)pp_Var1 >> 4) * -0x5555555555555555;
  return (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)
         (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)this;
}

Assistant:

static unique_ptr<NodeStatistics> ReadFileCardinality(ClientContext &context, const FunctionData *bind_data_p) {
	auto &bind_data = bind_data_p->Cast<ReadFileBindData>();
	auto result = make_uniq<NodeStatistics>();
	result->has_max_cardinality = true;
	result->max_cardinality = bind_data.files.size();
	result->has_estimated_cardinality = true;
	result->estimated_cardinality = bind_data.files.size();
	return result;
}